

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::Synchronize(WastParser *this,SynchronizeFunc func)

{
  bool bVar1;
  TokenType TVar2;
  TokenType TVar3;
  TokenTypePair TVar4;
  int iVar5;
  Token token;
  string local_b8;
  size_t local_98;
  char *pcStack_90;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_88;
  undefined8 uStack_80;
  Token local_70;
  
  iVar5 = 10;
  do {
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
    TVar4._M_elems[1] = TVar3;
    TVar4._M_elems[0] = TVar2;
    bVar1 = (*func)(TVar4);
    if (bVar1) {
      return (Result)Ok;
    }
    Consume(&local_70,this);
    if (local_70.token_type_ == Reserved) {
      local_88.offset = (size_t)local_70.loc.field_1.field_1.offset;
      uStack_80 = local_70.loc.field_1._8_8_;
      local_98 = local_70.loc.filename._M_len;
      pcStack_90 = local_70.loc.filename._M_str;
      Token::to_string_clamp_abi_cxx11_(&local_b8,&local_70,0x50);
      Error(this,0x1e94fc,local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return (Result)Error;
}

Assistant:

Result WastParser::Synchronize(SynchronizeFunc func) {
  static const int kMaxConsumed = 10;
  for (int i = 0; i < kMaxConsumed; ++i) {
    if (func(PeekPair())) {
      return Result::Ok;
    }

    Token token = Consume();
    if (token.token_type() == TokenType::Reserved) {
      Error(token.loc, "unexpected token %s.",
            token.to_string_clamp(kMaxErrorTokenLength).c_str());
    }
  }

  return Result::Error;
}